

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

void __thiscall Net::propagate_front(Net *this,int cur_layer)

{
  bool bVar1;
  reference a;
  reference pvVar2;
  reference this_00;
  reference pdVar3;
  double dVar4;
  double *i;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  vector<double,_std::allocator<double>_> local_30;
  int local_14;
  Net *pNStack_10;
  int cur_layer_local;
  Net *this_local;
  
  local_14 = cur_layer;
  pNStack_10 = this;
  a = std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::operator[](&this->weights,(long)cur_layer);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->mesh,(long)(local_14 + -1));
  std::vector<double,_std::allocator<double>_>::vector(&local_60,pvVar2);
  mult_matrix<double>(&local_48,a,&local_60);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->biases,(long)local_14);
  add_matrix<double>(&local_30,&local_48,pvVar2);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->meshZ,(long)local_14);
  std::vector<double,_std::allocator<double>_>::operator=(pvVar2,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_48);
  std::vector<double,_std::allocator<double>_>::~vector(&local_60);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->meshZ,(long)local_14);
  this_00 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](&this->mesh,(long)local_14);
  std::vector<double,_std::allocator<double>_>::operator=(this_00,pvVar2);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->mesh,(long)local_14);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(pvVar2);
  i = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&i);
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dVar4 = function(this,*pdVar3);
    *pdVar3 = dVar4;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Net::propagate_front(int cur_layer){
    meshZ[cur_layer] = add_matrix<double>(mult_matrix<double>(weights[cur_layer], mesh[cur_layer-1]), biases[cur_layer]);
    mesh[cur_layer] = meshZ[cur_layer];
    for (double & i : mesh[cur_layer])
        i = function(i);
}